

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall FlowGraph::SortLoopLists(FlowGraph *this)

{
  NodeBase **this_00;
  SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  uint uVar2;
  Loop *this_01;
  bool bVar3;
  uint uVar4;
  BasicBlock *pBVar5;
  Type *data;
  Type *ppBVar6;
  Loop **ppLVar7;
  undefined1 local_68 [8];
  EditingIterator iter;
  EditingIterator newIter;
  
  ppLVar7 = &this->loopList;
  this_00 = &iter.super_EditingIterator.last;
  do {
    this_01 = *ppLVar7;
    if (this_01 == (Loop *)0x0) {
      return;
    }
    pBVar5 = Loop::GetHeadBlock(this_01);
    pSVar1 = &this_01->blockList;
    iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
    local_68 = (undefined1  [8])pSVar1;
    iter.super_EditingIterator.super_Iterator.list =
         &pSVar1->super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>;
    uVar2 = pBVar5->number;
    while (uVar4 = uVar2,
          bVar3 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                            ((EditingIterator *)local_68), bVar3) {
      data = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)local_68);
      uVar2 = uVar4;
      if ((((*data)->field_0x18 & 1) == 0) && (uVar2 = (*data)->number, uVar2 < uVar4)) {
        SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
        UnlinkCurrentNode((EditingIterator *)local_68);
        iter.super_EditingIterator.last = (NodeBase *)pSVar1;
        do {
          bVar3 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                            ((EditingIterator *)this_00);
          if (!bVar3) break;
          ppBVar6 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                              ((Iterator *)this_00);
        } while ((((*ppBVar6)->field_0x18 & 1) != 0) || ((*ppBVar6)->number <= (*data)->number));
        SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
                  ((EditingIterator *)this_00,data);
        uVar2 = uVar4;
      }
    }
    ppLVar7 = &this_01->next;
  } while( true );
}

Assistant:

void
FlowGraph::SortLoopLists()
{
    // Sort the blocks in loopList
    for (Loop *loop = this->loopList; loop; loop = loop->next)
    {
        unsigned int lastBlockNumber = loop->GetHeadBlock()->GetBlockNum();
        // Insertion sort as the blockList is almost sorted in the loop.
        FOREACH_BLOCK_IN_LOOP_EDITING(block, loop, iter)
        {
            if (lastBlockNumber <= block->GetBlockNum())
            {
                lastBlockNumber = block->GetBlockNum();
            }
            else
            {
                iter.UnlinkCurrent();
                FOREACH_BLOCK_IN_LOOP_EDITING(insertBlock,loop,newIter)
                {
                    if (insertBlock->GetBlockNum() > block->GetBlockNum())
                    {
                        break;
                    }
                }NEXT_BLOCK_IN_LOOP_EDITING;
                newIter.InsertBefore(block);
            }
        }NEXT_BLOCK_IN_LOOP_EDITING;
    }
}